

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O3

Expression
dynet::detail::f<dynet::AffineTransform,std::initializer_list<dynet::Expression>>
          (initializer_list<dynet::Expression> *xs)

{
  uint uVar1;
  ComputationGraph *this;
  size_type sVar2;
  iterator pEVar3;
  iterator __position;
  VariableIndex VVar4;
  Node *pNVar5;
  pointer ppNVar6;
  pointer puVar7;
  long lVar8;
  Expression EVar9;
  VariableIndex new_node_index;
  vector<unsigned_int,_std::allocator<unsigned_int>_> xis;
  allocator_type local_3d;
  VariableIndex local_3c;
  Node *local_38;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  
  this = xs->_M_array->pg;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_30,xs->_M_len,(allocator_type *)&local_38);
  sVar2 = xs->_M_len;
  if (sVar2 != 0) {
    pEVar3 = xs->_M_array;
    lVar8 = 0;
    puVar7 = local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      *puVar7 = *(uint *)((long)&pEVar3->i + lVar8);
      puVar7 = puVar7 + 1;
      lVar8 = lVar8 + 0x10;
    } while (sVar2 << 4 != lVar8);
  }
  local_3c = (VariableIndex)
             ((ulong)((long)(this->nodes).
                            super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->nodes).
                           super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl
                           .super__Vector_impl_data._M_start) >> 3);
  pNVar5 = (Node *)operator_new(0x68);
  pNVar5->_vptr_Node = (_func_int **)&PTR__Node_005b4008;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pNVar5->args,
             (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_3d);
  (pNVar5->dim).nd = 0;
  (pNVar5->dim).bd = 1;
  pNVar5->device = (Device *)0x0;
  pNVar5->_vptr_Node = (_func_int **)&PTR__Node_005b4c80;
  __position._M_current =
       (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_38 = pNVar5;
  if (__position._M_current ==
      (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<dynet::Node*,std::allocator<dynet::Node*>>::_M_realloc_insert<dynet::Node*>
              ((vector<dynet::Node*,std::allocator<dynet::Node*>> *)this,__position,&local_38);
    ppNVar6 = (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *__position._M_current = pNVar5;
    ppNVar6 = (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_finish + 1;
    (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppNVar6;
  }
  ppNVar6[-1]->device = dynet::default_device;
  ComputationGraph::set_dim_for_new_node(this,&local_3c);
  VVar4 = local_3c;
  uVar1 = this->graph_id;
  if (local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  EVar9.graph_id = uVar1;
  EVar9.i = VVar4;
  EVar9.pg = this;
  return EVar9;
}

Assistant:

Expression f(const T& xs) {
  ComputationGraph *pg = xs.begin()->pg;
  std::vector<VariableIndex> xis(xs.size());
  int i = 0;
  for (auto xi = xs.begin(); xi != xs.end(); ++xi) xis[i++] = xi->i;
  return Expression(pg, pg->add_function<F>(xis));
}